

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

int Curl_SOCKS_getsock(connectdata *conn,curl_socket_t *sock,int sockindex)

{
  connect_t cVar1;
  
  *sock = conn->sock[sockindex];
  cVar1 = (conn->cnnct).state;
  if ((cVar1 < CONNECT_DONE) &&
     ((0x18510U >> (cVar1 & (CONNECT_REQ_READ_MORE|CONNECT_REQ_READ)) & 1) != 0)) {
    return 1;
  }
  return 0x10000;
}

Assistant:

int Curl_SOCKS_getsock(struct connectdata *conn, curl_socket_t *sock,
                       int sockindex)
{
  int rc = 0;
  sock[0] = conn->sock[sockindex];
  switch(conn->cnnct.state) {
  case CONNECT_RESOLVING:
  case CONNECT_SOCKS_READ:
  case CONNECT_AUTH_READ:
  case CONNECT_REQ_READ:
  case CONNECT_REQ_READ_MORE:
    rc = GETSOCK_READSOCK(0);
    break;
  default:
    rc = GETSOCK_WRITESOCK(0);
    break;
  }
  return rc;
}